

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall glslang::TPublicType::initType(TPublicType *this,TSourceLoc *l)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  ushort uVar4;
  
  this->basicType = EbtVoid;
  uVar4 = ((ushort)*(undefined4 *)&this->field_0xb8 & 0xf000) + 1;
  *(ushort *)&this->field_0xb8 = uVar4;
  this->arraySizes = (TArraySizes *)0x0;
  this->userDef = (TType *)0x0;
  iVar1 = l->string;
  iVar2 = l->line;
  (this->loc).name = l->name;
  (this->loc).string = iVar1;
  (this->loc).line = iVar2;
  uVar3 = *(undefined4 *)&l->field_0x14;
  (this->loc).column = l->column;
  *(undefined4 *)&(this->loc).field_0x14 = uVar3;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  *(ushort *)&this->field_0xb8 = uVar4 & 0x8001;
  return;
}

Assistant:

void initType(const TSourceLoc& l)
    {
        basicType = EbtVoid;
        vectorSize = 1u;
        matrixRows = 0;
        matrixCols = 0;
        arraySizes = nullptr;
        userDef = nullptr;
        loc = l;
        typeParameters = nullptr;
        coopmatNV = false;
        coopmatKHR = false;
        coopvecNV = false;
        spirvType = nullptr;
    }